

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

void __thiscall
unodb::detail::
create_leaf_if_needed<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>
          (detail *this,
          olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf,
          basic_art_key<unsigned_long> k,value_view v,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance)

{
  pointer __p;
  value_view v_00;
  undefined1 local_28 [8];
  pointer local_20;
  
  if (*(long *)(this + 8) == 0) {
    if (*(size_t *)this != v._M_extent._M_extent_value._M_extent_value) {
      __assert_fail("&cached_leaf.get_deleter().get_db() == &db_instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x58b,
                    "void unodb::detail::create_leaf_if_needed(olc_db_leaf_unique_ptr<Key, Value> &, basic_art_key<Key>, unodb::value_view, unodb::olc_db<Key, Value> &) [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    v_00._M_extent._M_extent_value = (size_t)k.field_0;
    v_00._M_ptr = (pointer)cached_leaf;
    make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db>
              ((art_key_type)local_28,v_00,
               (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               v._M_ptr);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::
    __uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::reset((__uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             *)this,__p);
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_28);
  }
  return;
}

Assistant:

void create_leaf_if_needed(olc_db_leaf_unique_ptr<Key, Value>& cached_leaf,
                           basic_art_key<Key> k, unodb::value_view v,
                           unodb::olc_db<Key, Value>& db_instance) {
  if (UNODB_DETAIL_LIKELY(cached_leaf == nullptr)) {
    UNODB_DETAIL_ASSERT(&cached_leaf.get_deleter().get_db() == &db_instance);
    // Do not assign because we do not need to assign the deleter
    // NOLINTNEXTLINE(misc-uniqueptr-reset-release)
    cached_leaf.reset(
        olc_art_policy<Key, Value>::make_db_leaf_ptr(k, v, db_instance)
            .release());
  }
}